

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdServer.hpp
# Opt level: O0

void __thiscall Statsd::StatsdServer::StatsdServer(StatsdServer *this,unsigned_short port)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  __cxx11 local_a8 [32];
  string local_88 [32];
  undefined1 local_68 [8];
  sockaddr_in address;
  string local_38 [38];
  unsigned_short local_12;
  StatsdServer *pSStack_10;
  unsigned_short port_local;
  StatsdServer *this_local;
  
  local_12 = port;
  pSStack_10 = this;
  std::__cxx11::string::string((string *)&this->m_errorMessage);
  iVar2 = socket(2,2,0x11);
  this->m_socket = iVar2;
  bVar1 = detail::isValidSocket(this->m_socket);
  if (bVar1) {
    memset(local_68,0,0x10);
    local_68._0_2_ = 2;
    local_68._2_2_ = htons(local_12);
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    iVar2 = bind(this->m_socket,(sockaddr *)local_68,0x10);
    if (iVar2 != 0) {
      close(this->m_socket);
      this->m_socket = -1;
      piVar3 = __errno_location();
      std::__cxx11::to_string(local_a8,*piVar3);
      std::operator+((char *)local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "bind failed: errno=");
      std::__cxx11::string::operator=((string *)&this->m_errorMessage,local_88);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string((string *)local_a8);
    }
  }
  else {
    piVar3 = __errno_location();
    std::__cxx11::to_string((__cxx11 *)address.sin_zero,*piVar3);
    std::operator+((char *)local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "socket creation failed: errno=");
    std::__cxx11::string::operator=((string *)&this->m_errorMessage,local_38);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string((string *)address.sin_zero);
  }
  return;
}

Assistant:

StatsdServer(unsigned short port = 8125) noexcept {
#ifdef _WIN32
        if (!detail::WinSockSingleton::getInstance().ok()) {
            m_errorMessage = "WSAStartup failed: errno=" + std::to_string(SOCKET_ERRNO);
        }
#endif

        // Create the socket
        m_socket = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
        if (!detail::isValidSocket(m_socket)) {
            m_errorMessage = "socket creation failed: errno=" + std::to_string(SOCKET_ERRNO);
            return;
        }

        // Binding should be with ipv4 to all interfaces
        struct sockaddr_in address {};
        address.sin_family = AF_INET;
        address.sin_port = htons(port);
        address.sin_addr.s_addr = INADDR_ANY;

        // Try to bind
        if (bind(m_socket, reinterpret_cast<const struct sockaddr*>(&address), sizeof(address)) != 0) {
            SOCKET_CLOSE(m_socket);
            m_socket = k_invalidSocket;
            m_errorMessage = "bind failed: errno=" + std::to_string(SOCKET_ERRNO);
        }
    }